

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O1

void nite::strSplit(string *input,string *split,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *list)

{
  pointer pcVar1;
  size_type sVar2;
  int iVar3;
  ulong uVar4;
  string local_70;
  string local_50;
  
  if ((list->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (list->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(list);
  }
  pcVar1 = (input->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + input->_M_string_length);
  strRemoveCoin(&local_50,&local_70,split);
  std::__cxx11::string::operator=((string *)input,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  do {
    iVar3 = std::__cxx11::string::find((char *)input,(ulong)(split->_M_dataplus)._M_p,0);
    sVar2 = input->_M_string_length;
    if (iVar3 == -1) {
      if (sVar2 != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(list,input);
      }
    }
    else {
      if ((int)sVar2 + -1 == iVar3) {
        uVar4 = sVar2 - 1;
      }
      else {
        if (iVar3 != 0) {
          subStr(&local_50,input,0,iVar3 - 1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)list,
                     &local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          subStr(&local_50,input,iVar3 + (int)split->_M_string_length,
                 (int)input->_M_string_length - 1);
          std::__cxx11::string::operator=((string *)input,(string *)&local_50);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          goto LAB_0018c5f8;
        }
        uVar4 = 0;
      }
      std::__cxx11::string::erase((ulong)input,uVar4);
    }
LAB_0018c5f8:
    if (iVar3 == -1) {
      return;
    }
  } while( true );
}

Assistant:

void nite::strSplit(String input, const String &split, Vector<String> &list){
	if ( !list.size() ){
		list.clear();
	}

	input = nite::strRemoveCoin(input, split);

	while (1){
		int k = input.find(split);

		if (k == -1){
			if (input.length()>0){
				list.push_back(input);
			}
			break;
		}

		if (k == (int)input.length()-1){
			input.erase(input.length()-1, split.length());
			continue;
		}

		if (k == 0){
			input.erase(0, split.length());
			continue;
		}

		list.push_back(subStr(input, 0,k-1));
		input = nite::subStr(input, k+split.length(), input.length()-1);
	}

	return;
}